

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_2::Flex::ComputeRequirement(Flex *this)

{
  bool bVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  Requirement local_3c;
  Flex *local_10;
  Flex *this_local;
  
  (this->super_Node).requirement_.min_x = 0;
  (this->super_Node).requirement_.min_y = 0;
  local_10 = this;
  bVar1 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::empty(&(this->super_Node).children_);
  if (!bVar1) {
    p_Var2 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             operator[](&(this->super_Node).children_,0);
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    (*peVar3->_vptr_Node[2])();
    p_Var2 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             operator[](&(this->super_Node).children_,0);
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    Node::requirement(&local_3c,peVar3);
    memcpy(&(this->super_Node).requirement_,&local_3c,0x2c);
  }
  (*this->f_)(&(this->super_Node).requirement_);
  return;
}

Assistant:

void ComputeRequirement() override {
    requirement_.min_x = 0;
    requirement_.min_y = 0;
    if (!children_.empty()) {
      children_[0]->ComputeRequirement();
      requirement_ = children_[0]->requirement();
    }
    f_(requirement_);
  }